

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_mark.cpp
# Opt level: O2

void duckdb::MarkJoinComparisonSwitch
               (Vector *left,Vector *right,idx_t lcount,idx_t rcount,bool *found_match,
               ExpressionType comparison_type)

{
  PhysicalType PVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  InternalException *this;
  NotImplementedException *pNVar5;
  idx_t j_78;
  idx_t iVar6;
  ulong uVar7;
  idx_t iVar8;
  idx_t j_2;
  idx_t iVar9;
  long *plVar10;
  idx_t j;
  idx_t i_2;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  UnifiedVectorFormat right_data;
  Vector left_reference;
  allocator local_49;
  LogicalType local_48;
  
  PVar1 = (left->type).physical_type_;
  if ((PVar1 < 0x1e) && ((0x21800000U >> (PVar1 & 0x1f) & 1) != 0)) {
    LogicalType::LogicalType(&local_48,&left->type);
    Vector::Vector(&left_reference,&local_48,0x800);
    LogicalType::~LogicalType(&local_48);
    for (iVar9 = 0; lcount != iVar9; iVar9 = iVar9 + 1) {
      if (found_match[iVar9] == false) {
        ConstantVector::Reference(&left_reference,left,iVar9,rcount);
        switch(comparison_type) {
        case COMPARE_BOUNDARY_START:
          iVar2 = VectorOperations::Equals
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
          break;
        case COMPARE_NOTEQUAL:
          iVar2 = VectorOperations::NotEquals
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
          break;
        case COMPARE_LESSTHAN:
          iVar2 = VectorOperations::LessThan
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
          break;
        case COMPARE_GREATERTHAN:
          iVar2 = VectorOperations::GreaterThan
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
          break;
        case COMPARE_LESSTHANOREQUALTO:
          iVar2 = VectorOperations::LessThanEquals
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
          break;
        case COMPARE_GREATERTHANOREQUALTO:
          iVar2 = VectorOperations::GreaterThanEquals
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
          break;
        default:
          this = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&right_data,"Unsupported comparison type for MarkJoinNested",
                     &local_49);
          InternalException::InternalException(this,(string *)&right_data);
          __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        case COMPARE_DISTINCT_FROM:
          iVar2 = VectorOperations::DistinctFrom
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0);
          break;
        case COMPARE_BOUNDARY_END:
          iVar2 = VectorOperations::NotDistinctFrom
                            (&left_reference,right,
                             (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                             (optional_ptr<duckdb::SelectionVector,_true>)0x0);
        }
        if (iVar2 != 0) {
          found_match[iVar9] = true;
        }
      }
    }
    Vector::~Vector(&left_reference);
  }
  else {
    switch(comparison_type) {
    case COMPARE_BOUNDARY_START:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(data_t *)(left_reference.type._0_8_ + iVar2) == right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(data_t *)(left_reference.type._0_8_ + iVar2) == right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(left_reference.type._0_8_ + iVar2 * 2) ==
                    *(short *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(left_reference.type._0_8_ + iVar2 * 2) ==
                    *(short *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(left_reference.type._0_8_ + iVar2 * 4) ==
                    *(int *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(left_reference.type._0_8_ + iVar2 * 4) ==
                    *(int *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(left_reference.type._0_8_ + iVar2 * 8) ==
                    *(long *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(left_reference.type._0_8_ + iVar2 * 8) ==
                    *(long *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac38d1_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = Equals::Operation<float>
                                       ((float *)(left_reference.type._0_8_ + uVar3 * 4),
                                        (float *)(right_data.data + uVar4 * 4)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = Equals::Operation<double>
                                       ((double *)(left_reference.type._0_8_ + uVar3 * 8),
                                        (double *)(right_data.data + uVar4 * 8)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::Equals
                                         ((string_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (string_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator==
                                         ((uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (uhugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12))
                  {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac38d1_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                plVar10 = (long *)(iVar2 * 0x10 + left_reference.type._0_8_);
                for (iVar2 = 0; rcount != iVar2; iVar2 = iVar2 + 1) {
                  iVar8 = iVar2;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar8 = (idx_t)(right_data.sel)->sel_vector[iVar2];
                  }
                  if ((((right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                         validity_mask == (unsigned_long *)0x0) ||
                       ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                         validity_mask[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) &&
                      (*plVar10 == *(long *)(right_data.data + iVar8 * 0x10))) &&
                     (plVar10[1] == *(long *)(right_data.data + iVar8 * 0x10 + 8))) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      break;
    case COMPARE_NOTEQUAL:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(data_t *)(left_reference.type._0_8_ + iVar2) != right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(data_t *)(left_reference.type._0_8_ + iVar2) != right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(left_reference.type._0_8_ + iVar2 * 2) !=
                    *(short *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(left_reference.type._0_8_ + iVar2 * 2) !=
                    *(short *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(left_reference.type._0_8_ + iVar2 * 4) !=
                    *(int *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(left_reference.type._0_8_ + iVar2 * 4) !=
                    *(int *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(left_reference.type._0_8_ + iVar2 * 8) !=
                    *(long *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(left_reference.type._0_8_ + iVar2 * 8) !=
                    *(long *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac3ad5_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = NotEquals::Operation<float>
                                       ((float *)(left_reference.type._0_8_ + uVar3 * 4),
                                        (float *)(right_data.data + uVar4 * 4)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = NotEquals::Operation<double>
                                       ((double *)(left_reference.type._0_8_ + uVar3 * 8),
                                        (double *)(right_data.data + uVar4 * 8)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = NotEquals::Operation<duckdb::string_t>
                                         ((string_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (string_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = NotEquals::Operation<duckdb::uhugeint_t>
                                         ((uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (uhugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12))
                  {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac3ad5_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                plVar10 = (long *)(iVar2 * 0x10 + left_reference.type._0_8_);
                for (iVar2 = 0; rcount != iVar2; iVar2 = iVar2 + 1) {
                  iVar8 = iVar2;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar8 = (idx_t)(right_data.sel)->sel_vector[iVar2];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) &&
                     ((*plVar10 != *(long *)(right_data.data + iVar8 * 0x10) ||
                      (plVar10[1] != *(long *)(right_data.data + iVar8 * 0x10 + 8))))) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      break;
    case COMPARE_LESSTHAN:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(char *)(left_reference.type._0_8_ + iVar2) < (char)right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(byte *)(left_reference.type._0_8_ + iVar2) < right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ushort *)(left_reference.type._0_8_ + iVar2 * 2) <
                    *(ushort *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(left_reference.type._0_8_ + iVar2 * 2) <
                    *(short *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(uint *)(left_reference.type._0_8_ + iVar2 * 4) <
                    *(uint *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(left_reference.type._0_8_ + iVar2 * 4) <
                    *(int *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ulong *)(left_reference.type._0_8_ + iVar2 * 8) <
                    *(ulong *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(left_reference.type._0_8_ + iVar2 * 8) <
                    *(long *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac3cd8_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = GreaterThan::Operation<float>
                                       ((float *)(right_data.data + uVar4 * 4),
                                        (float *)(left_reference.type._0_8_ + uVar3 * 4)), bVar12))
                {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = GreaterThan::Operation<double>
                                       ((double *)(right_data.data + uVar4 * 8),
                                        (double *)(left_reference.type._0_8_ + uVar3 * 8)), bVar12))
                {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::GreaterThan
                                         ((string_t *)(right_data.data + iVar6 * 0x10),
                                          (string_t *)(iVar2 * 0x10 + left_reference.type._0_8_)),
                     bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator>
                                         ((uhugeint_t *)(right_data.data + iVar6 * 0x10),
                                          (uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_)),
                     bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac3cd8_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = GreaterThan::Operation<duckdb::hugeint_t>
                                         ((hugeint_t *)(right_data.data + iVar6 * 0x10),
                                          (hugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_)),
                     bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      break;
    case COMPARE_GREATERTHAN:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   ((char)right_data.data[iVar6] < *(char *)(left_reference.type._0_8_ + iVar2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (right_data.data[iVar6] < *(byte *)(left_reference.type._0_8_ + iVar2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ushort *)(right_data.data + iVar6 * 2) <
                    *(ushort *)(left_reference.type._0_8_ + iVar2 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(right_data.data + iVar6 * 2) <
                    *(short *)(left_reference.type._0_8_ + iVar2 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(uint *)(right_data.data + iVar6 * 4) <
                    *(uint *)(left_reference.type._0_8_ + iVar2 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(right_data.data + iVar6 * 4) <
                    *(int *)(left_reference.type._0_8_ + iVar2 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ulong *)(right_data.data + iVar6 * 8) <
                    *(ulong *)(left_reference.type._0_8_ + iVar2 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(right_data.data + iVar6 * 8) <
                    *(long *)(left_reference.type._0_8_ + iVar2 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac3dd9_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = GreaterThan::Operation<float>
                                       ((float *)(left_reference.type._0_8_ + uVar3 * 4),
                                        (float *)(right_data.data + uVar4 * 4)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = GreaterThan::Operation<double>
                                       ((double *)(left_reference.type._0_8_ + uVar3 * 8),
                                        (double *)(right_data.data + uVar4 * 8)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = string_t::StringComparisonOperators::GreaterThan
                                         ((string_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (string_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = uhugeint_t::operator>
                                         ((uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (uhugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12))
                  {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac3dd9_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = GreaterThan::Operation<duckdb::hugeint_t>
                                         ((hugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (hugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      break;
    case COMPARE_LESSTHANOREQUALTO:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(char *)(left_reference.type._0_8_ + iVar2) <= (char)right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(byte *)(left_reference.type._0_8_ + iVar2) <= right_data.data[iVar6])) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ushort *)(left_reference.type._0_8_ + iVar2 * 2) <=
                    *(ushort *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(left_reference.type._0_8_ + iVar2 * 2) <=
                    *(short *)(right_data.data + iVar6 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(uint *)(left_reference.type._0_8_ + iVar2 * 4) <=
                    *(uint *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(left_reference.type._0_8_ + iVar2 * 4) <=
                    *(int *)(right_data.data + iVar6 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ulong *)(left_reference.type._0_8_ + iVar2 * 8) <=
                    *(ulong *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(left_reference.type._0_8_ + iVar2 * 8) <=
                    *(long *)(right_data.data + iVar6 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac39d3_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = LessThanEquals::Operation<float>
                                       ((float *)(left_reference.type._0_8_ + uVar3 * 4),
                                        (float *)(right_data.data + uVar4 * 4)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = LessThanEquals::Operation<double>
                                       ((double *)(left_reference.type._0_8_ + uVar3 * 8),
                                        (double *)(right_data.data + uVar4 * 8)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = LessThanEquals::Operation<duckdb::string_t>
                                         ((string_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (string_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = LessThanEquals::Operation<duckdb::uhugeint_t>
                                         ((uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (uhugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12))
                  {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac39d3_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = LessThanEquals::Operation<duckdb::hugeint_t>
                                         ((hugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (hugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      break;
    case COMPARE_GREATERTHANOREQUALTO:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   ((char)right_data.data[iVar6] <= *(char *)(left_reference.type._0_8_ + iVar2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (right_data.data[iVar6] <= *(byte *)(left_reference.type._0_8_ + iVar2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ushort *)(right_data.data + iVar6 * 2) <=
                    *(ushort *)(left_reference.type._0_8_ + iVar2 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(short *)(right_data.data + iVar6 * 2) <=
                    *(short *)(left_reference.type._0_8_ + iVar2 * 2))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(uint *)(right_data.data + iVar6 * 4) <=
                    *(uint *)(left_reference.type._0_8_ + iVar2 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(int *)(right_data.data + iVar6 * 4) <=
                    *(int *)(left_reference.type._0_8_ + iVar2 * 4))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(ulong *)(right_data.data + iVar6 * 8) <=
                    *(ulong *)(left_reference.type._0_8_ + iVar2 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0)) {
              for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                   (*(long *)(right_data.data + iVar6 * 8) <=
                    *(long *)(left_reference.type._0_8_ + iVar2 * 8))) {
                  found_match[iVar9] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac3bd7_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = GreaterThanEquals::Operation<float>
                                       ((float *)(left_reference.type._0_8_ + uVar3 * 4),
                                        (float *)(right_data.data + uVar4 * 4)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if ((left_reference.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((ulong)(&(left_reference.type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
              for (uVar7 = 0; rcount != uVar7; uVar7 = uVar7 + 1) {
                uVar4 = uVar7;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
                }
                if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      == (unsigned_long *)0x0) ||
                    ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) &&
                   (bVar12 = GreaterThanEquals::Operation<double>
                                       ((double *)(left_reference.type._0_8_ + uVar3 * 8),
                                        (double *)(right_data.data + uVar4 * 8)), bVar12)) {
                  found_match[uVar11] = true;
                  break;
                }
              }
            }
          }
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = GreaterThanEquals::Operation<duckdb::string_t>
                                         ((string_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (string_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = GreaterThanEquals::Operation<duckdb::uhugeint_t>
                                         ((uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (uhugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12))
                  {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac3bd7_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if ((left_reference.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                   (element_type *)0x0) ||
                 (((ulong)(&(left_reference.type.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1) != 0))
              {
                for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
                  iVar6 = iVar8;
                  if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                    iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                  }
                  if (((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) ||
                      ((right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                     (bVar12 = GreaterThanEquals::Operation<duckdb::hugeint_t>
                                         ((hugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                          (hugeint_t *)(right_data.data + iVar6 * 0x10)), bVar12)) {
                    found_match[iVar9] = true;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      break;
    default:
      pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&left_reference,"Unimplemented comparison type for join!",
                 (allocator *)&right_data);
      NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
      __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case COMPARE_DISTINCT_FROM:
      switch(PVar1) {
      case BOOL:
      case INT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac3fd4:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(data_t *)(left_reference.type._0_8_ + iVar2) != right_data.data[iVar6])
              goto LAB_01ac3fd4;
            }
          }
        }
        break;
      case UINT8:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac6ffa:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(data_t *)(left_reference.type._0_8_ + iVar2) != right_data.data[iVar6])
              goto LAB_01ac6ffa;
            }
          }
        }
        break;
      case UINT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac7d22:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(short *)(left_reference.type._0_8_ + iVar2 * 2) !=
                       *(short *)(right_data.data + iVar6 * 2)) goto LAB_01ac7d22;
            }
          }
        }
        break;
      case INT16:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac6092:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(short *)(left_reference.type._0_8_ + iVar2 * 2) !=
                       *(short *)(right_data.data + iVar6 * 2)) goto LAB_01ac6092;
            }
          }
        }
        break;
      case UINT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac800f:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(int *)(left_reference.type._0_8_ + iVar2 * 4) !=
                       *(int *)(right_data.data + iVar6 * 4)) goto LAB_01ac800f;
            }
          }
        }
        break;
      case INT32:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac8118:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(int *)(left_reference.type._0_8_ + iVar2 * 4) !=
                       *(int *)(right_data.data + iVar6 * 4)) goto LAB_01ac8118;
            }
          }
        }
        break;
      case UINT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac7b25:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(long *)(left_reference.type._0_8_ + iVar2 * 8) !=
                       *(long *)(right_data.data + iVar6 * 8)) goto LAB_01ac7b25;
            }
          }
        }
        break;
      case INT64:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
          if (found_match[iVar9] == false) {
            iVar2 = iVar9;
            if (*(long *)left_reference._0_8_ != 0) {
              iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                       == 0;
            }
            for (iVar8 = 0; rcount != iVar8; iVar8 = iVar8 + 1) {
              iVar6 = iVar8;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
              }
              if ((bVar12 | bVar13) == 1) {
                if (bVar12 != bVar13) {
LAB_01ac7852:
                  found_match[iVar9] = true;
                  break;
                }
              }
              else if (*(long *)(left_reference.type._0_8_ + iVar2 * 8) !=
                       *(long *)(right_data.data + iVar6 * 8)) goto LAB_01ac7852;
            }
          }
        }
        break;
      case UINT64|UINT8:
switchD_01ac3edb_caseD_a:
        pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_reference,"Unimplemented type for mark join!",
                   (allocator *)&right_data);
        NotImplementedException::NotImplementedException(pNVar5,(string *)&left_reference);
        __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1)
                       == 0;
            }
            uVar7 = 0;
            do {
              if (rcount == uVar7) goto LAB_01ac5694;
              uVar4 = uVar7;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
              }
              bVar13 = DistinctFrom::Operation<float>
                                 ((float *)(left_reference.type._0_8_ + uVar3 * 4),
                                  (float *)(right_data.data + uVar4 * 4),bVar12,bVar13);
              uVar7 = uVar7 + 1;
            } while (!bVar13);
            found_match[uVar11] = true;
          }
LAB_01ac5694:
        }
        break;
      case DOUBLE:
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
        UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
        Vector::ToUnifiedFormat(right,rcount,&right_data);
        for (uVar11 = 0; uVar11 != lcount; uVar11 = uVar11 + 1) {
          if (found_match[uVar11] == false) {
            uVar3 = uVar11;
            if (*(long *)left_reference._0_8_ != 0) {
              uVar3 = (ulong)*(uint *)(*(long *)left_reference._0_8_ + uVar11 * 4);
            }
            if (left_reference.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar12 = false;
            }
            else {
              bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[uVar3 >> 6] >> (uVar3 & 0x3f) & 1)
                       == 0;
            }
            uVar7 = 0;
            do {
              if (rcount == uVar7) goto LAB_01ac822e;
              uVar4 = uVar7;
              if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                uVar4 = (ulong)(right_data.sel)->sel_vector[uVar7];
              }
              if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                bVar13 = false;
              }
              else {
                bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                          validity_mask[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
              }
              bVar13 = DistinctFrom::Operation<double>
                                 ((double *)(left_reference.type._0_8_ + uVar3 * 8),
                                  (double *)(right_data.data + uVar4 * 8),bVar12,bVar13);
              uVar7 = uVar7 + 1;
            } while (!bVar13);
            found_match[uVar11] = true;
          }
LAB_01ac822e:
        }
        break;
      default:
        if (PVar1 == VARCHAR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if (left_reference.type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                         == 0;
              }
              iVar8 = 0;
              do {
                if (rcount == iVar8) goto LAB_01ac8edd;
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  bVar13 = false;
                }
                else {
                  bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
                }
                bVar13 = DistinctFrom::Operation<duckdb::string_t>
                                   ((string_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                    (string_t *)(right_data.data + iVar6 * 0x10),bVar12,bVar13);
                iVar8 = iVar8 + 1;
              } while (!bVar13);
              found_match[iVar9] = true;
            }
LAB_01ac8edd:
          }
        }
        else if (PVar1 == UINT128) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if (left_reference.type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                         == 0;
              }
              iVar8 = 0;
              do {
                if (rcount == iVar8) goto LAB_01ac8fec;
                iVar6 = iVar8;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar6 = (idx_t)(right_data.sel)->sel_vector[iVar8];
                }
                if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  bVar13 = false;
                }
                else {
                  bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) == 0;
                }
                bVar13 = DistinctFrom::Operation<duckdb::uhugeint_t>
                                   ((uhugeint_t *)(iVar2 * 0x10 + left_reference.type._0_8_),
                                    (uhugeint_t *)(right_data.data + iVar6 * 0x10),bVar12,bVar13);
                iVar8 = iVar8 + 1;
              } while (!bVar13);
              found_match[iVar9] = true;
            }
LAB_01ac8fec:
          }
        }
        else {
          if (PVar1 != INT128) goto switchD_01ac3edb_caseD_a;
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
          UnifiedVectorFormat::UnifiedVectorFormat(&right_data);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)&left_reference);
          Vector::ToUnifiedFormat(right,rcount,&right_data);
          for (iVar9 = 0; iVar9 != lcount; iVar9 = iVar9 + 1) {
            if (found_match[iVar9] == false) {
              iVar2 = iVar9;
              if (*(long *)left_reference._0_8_ != 0) {
                iVar2 = (idx_t)*(uint *)(*(long *)left_reference._0_8_ + iVar9 * 4);
              }
              if (left_reference.type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                bVar12 = ((ulong)(&(left_reference.type.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar2 >> 6] >> (iVar2 & 0x3f) & 1)
                         == 0;
              }
              plVar10 = (long *)(iVar2 * 0x10 + left_reference.type._0_8_);
              for (iVar2 = 0; rcount != iVar2; iVar2 = iVar2 + 1) {
                iVar8 = iVar2;
                if ((right_data.sel)->sel_vector != (sel_t *)0x0) {
                  iVar8 = (idx_t)(right_data.sel)->sel_vector[iVar2];
                }
                if (right_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  bVar13 = false;
                }
                else {
                  bVar13 = (right_data.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) == 0;
                }
                if ((bVar12 | bVar13) == 1) {
                  if (bVar12 != bVar13) {
LAB_01ac47b7:
                    found_match[iVar9] = true;
                    break;
                  }
                }
                else if ((*plVar10 != *(long *)(right_data.data + iVar8 * 0x10)) ||
                        (plVar10[1] != *(long *)(right_data.data + iVar8 * 0x10 + 8)))
                goto LAB_01ac47b7;
              }
            }
          }
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&right_data);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&left_reference);
  }
  return;
}

Assistant:

static void MarkJoinComparisonSwitch(Vector &left, Vector &right, idx_t lcount, idx_t rcount, bool found_match[],
                                     ExpressionType comparison_type) {
	switch (left.GetType().InternalType()) {
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return MarkJoinNested(left, right, lcount, rcount, found_match, comparison_type);
	default:
		break;
	}
	D_ASSERT(left.GetType() == right.GetType());
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
		return MarkJoinSwitch<Equals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_NOTEQUAL:
		return MarkJoinSwitch<NotEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_LESSTHAN:
		return MarkJoinSwitch<LessThan>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_GREATERTHAN:
		return MarkJoinSwitch<GreaterThan>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return MarkJoinSwitch<LessThanEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return MarkJoinSwitch<GreaterThanEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return MarkJoinSwitch<DistinctFrom>(left, right, lcount, rcount, found_match);
	default:
		throw NotImplementedException("Unimplemented comparison type for join!");
	}
}